

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

void __thiscall Assimp::Exporter::UnregisterExporter(Exporter *this,char *id)

{
  ExporterPimpl *pEVar1;
  pointer pEVar2;
  int iVar3;
  const_iterator __position;
  
  pEVar1 = this->pimpl;
  if (pEVar1 == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x213,"void Assimp::Exporter::UnregisterExporter(const char *)");
  }
  __position._M_current =
       (pEVar1->mExporters).
       super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (pEVar1->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__position._M_current == pEVar2) {
      return;
    }
    iVar3 = strcmp(((__position._M_current)->mDescription).id,id);
    if (iVar3 == 0) break;
    __position._M_current = __position._M_current + 1;
  }
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::erase(&pEVar1->mExporters,__position);
  return;
}

Assistant:

void Exporter::UnregisterExporter(const char* id) {
	ai_assert(nullptr != pimpl);
	for (std::vector<ExportFormatEntry>::iterator it = pimpl->mExporters.begin();
            it != pimpl->mExporters.end(); ++it) {
        if (!strcmp((*it).mDescription.id,id)) {
            pimpl->mExporters.erase(it);
            break;
        }
    }
}